

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partial_sum_max.hpp
# Opt level: O0

pair<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_int>
burst::
partial_sum_max<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::plus<void>,std::less<void>>
          (int *first,int *last,int *result)

{
  int iVar1;
  bool bVar2;
  reference piVar3;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *p_Var4;
  pair<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_int> pVar5;
  int local_48;
  int local_44;
  int local_40;
  int new_sum;
  int current;
  int max;
  int sum;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> result_local;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> last_local;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> first_local;
  undefined4 local_10;
  
  _sum = result;
  result_local._M_current = last;
  last_local._M_current = first;
  bVar2 = __gnu_cxx::operator!=(&last_local,&result_local);
  if (bVar2) {
    piVar3 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&last_local);
    iVar1 = *piVar3;
    new_sum = iVar1;
    current = iVar1;
    piVar3 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)&sum);
    *piVar3 = iVar1;
    while( true ) {
      p_Var4 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator++(&last_local);
      bVar2 = __gnu_cxx::operator!=(p_Var4,&result_local);
      if (!bVar2) break;
      piVar3 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&last_local);
      local_40 = *piVar3;
      bVar2 = (((std::forward<int&>)({parm#1}))<((std::forward<int&>)({parm#2})))std::less<void>::
              operator()((void *)((long)&max + 2),&new_sum,&local_40);
      if (bVar2) {
        new_sum = local_40;
      }
      local_44 = std::plus<void>::operator()((plus<void> *)((long)&max + 3),&current,&local_40);
      current = local_44;
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)&sum);
      iVar1 = current;
      piVar3 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)&sum);
      *piVar3 = iVar1;
    }
    p_Var4 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
             operator++((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)&sum);
    std::pair<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_int>::
    pair<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_&,_int_&,_true>
              ((pair<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_int>
                *)&first_local,p_Var4,&new_sum);
  }
  else {
    local_48 = 0;
    std::pair<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_int>::
    pair<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_&,_int,_true>
              ((pair<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_int>
                *)&first_local,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)&sum,&local_48);
  }
  pVar5._12_4_ = 0;
  pVar5.first._M_current = first_local._M_current;
  pVar5.second = local_10;
  return pVar5;
}

Assistant:

std::pair<OutputIterator, iterator_value_t<InputIterator>>
        partial_sum_max
        (
            InputIterator first,
            InputIterator last,
            OutputIterator result,
            BinaryFunction plus,
            BinaryPredicate less
        )
    {
        if (first != last)
        {
            auto sum = *first;
            auto max = sum;

            *result = sum;

            while (++first != last)
            {
                auto current = *first;
                if (less(max, current))
                {
                    max = current;
                }

                auto new_sum = plus(std::move(sum), std::move(current));
                sum = std::move(new_sum);

                ++result;
                *result = sum;
            }

            return {++result, max};
        }

        return {result, iterator_value_t<InputIterator>{}};
    }